

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_semacheck2.c
# Opt level: O1

void free_postfix_subexpr(gnode_postfix_subexpr_t *subnode)

{
  uint32_t uVar1;
  ulong uVar2;
  gnode_t **__ptr;
  gnode_t *pgVar3;
  ulong uVar4;
  
  uVar1 = (subnode->base).refcount;
  if (uVar1 != 0) {
    (subnode->base).refcount = uVar1 - 1;
    return;
  }
  pgVar3 = (gnode_t *)(subnode->field_1).args;
  if ((subnode->base).tag == NODE_CALL_EXPR) {
    if (pgVar3 != (gnode_t *)0x0) {
      uVar2._0_4_ = pgVar3->tag;
      uVar2._4_4_ = pgVar3->refcount;
      if (uVar2 != 0) {
        uVar4 = 0;
        do {
          if (uVar4 < ((subnode->field_1).args)->n) {
            pgVar3 = ((subnode->field_1).args)->p[uVar4];
          }
          else {
            pgVar3 = (gnode_t *)0x0;
          }
          gnode_free(pgVar3);
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      __ptr = ((subnode->field_1).args)->p;
      if (__ptr != (gnode_t **)0x0) {
        free(__ptr);
      }
      free((subnode->field_1).expr);
    }
  }
  else {
    gnode_free(pgVar3);
  }
  free(subnode);
  return;
}

Assistant:

static void free_postfix_subexpr (gnode_postfix_subexpr_t *subnode) {
    // check refcount
    if (subnode->base.refcount > 0) {--subnode->base.refcount; return;}

    // manually free postfix subnode
    gnode_n tag = subnode->base.tag;
    if (tag == NODE_CALL_EXPR) {
        if (subnode->args) {
            gnode_array_each(subnode->args, gnode_free(val););
            gnode_array_free(subnode->args);
        }
    } else {
        gnode_free(subnode->expr);
    }

    mem_free((gnode_t*)subnode);
}